

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O3

void assert_equal_(char *file,int line,char *expression,intptr_t tried,intptr_t expected)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  TestReporter *pTVar2;
  
  pTVar2 = get_test_reporter();
  p_Var1 = pTVar2->assert_true;
  pTVar2 = get_test_reporter();
  (*p_Var1)(pTVar2,file,line,(uint)(tried == expected),"[%s] should be [%d] but was [%d]\n",
            expression,expected,tried);
  return;
}

Assistant:

void assert_equal_(const char *file, int line, const char *expression, intptr_t tried, intptr_t expected) {
    (*get_test_reporter()->assert_true)(
            get_test_reporter(),
            file,
            line,
            (tried == expected),
            "[%s] should be [%d] but was [%d]\n", expression, expected, tried);
}